

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

uint32_t __thiscall
asmjit::CodeHolder::getLabelIdByName
          (CodeHolder *this,char *name,size_t nameLength,uint32_t parentId)

{
  int iVar1;
  ZoneHashNode *__s1;
  ZoneHashNode *pZVar2;
  uint uVar3;
  ulong __n;
  bool bVar4;
  ulong local_38;
  
  local_38 = nameLength;
  anon_unknown_32::CodeHolder_hashNameAndFixLen(name,&local_38);
  if (local_38 != 0) {
    pZVar2 = *(this->_namedLabels).super_ZoneHashBase._data;
    bVar4 = pZVar2 == (ZoneHashNode *)0x0;
    if (!bVar4) {
      uVar3 = (uint)local_38;
      __n = local_38 & 0xffffffff;
      do {
        if (*(uint *)(pZVar2 + 0x30) == uVar3) {
          if (*(uint *)(pZVar2 + 0x30) < 0xc) {
            __s1 = pZVar2 + 0x34;
          }
          else {
            __s1 = *(ZoneHashNode **)(pZVar2 + 0x38);
          }
          iVar1 = bcmp(__s1,name,__n);
          if (iVar1 == 0) {
            if (bVar4) {
              return 0;
            }
            return *(uint32_t *)(pZVar2 + 0xc);
          }
        }
        pZVar2 = *(ZoneHashNode **)pZVar2;
        bVar4 = pZVar2 == (ZoneHashNode *)0x0;
      } while (!bVar4);
    }
  }
  return 0;
}

Assistant:

uint32_t CodeHolder::getLabelIdByName(const char* name, size_t nameLength, uint32_t parentId) noexcept {
  uint32_t hVal = CodeHolder_hashNameAndFixLen(name, nameLength);
  if (ASMJIT_UNLIKELY(!nameLength)) return 0;

  LabelEntry* le = _namedLabels.get(LabelByName(name, nameLength, hVal));
  return le ? le->getId() : static_cast<uint32_t>(0);
}